

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# picotls.c
# Opt level: O2

int parse_record(ptls_t *tls,st_ptls_record_t *rec,uint8_t *src,size_t *len)

{
  anon_struct_64_2_7cec4369_for_recvbuf *buf;
  uint8_t uVar1;
  ulong uVar2;
  int iVar3;
  uint8_t *delta;
  uint8_t *__n;
  uint8_t *puVar4;
  uint8_t *puVar5;
  uint8_t *puVar6;
  
  puVar4 = (uint8_t *)*len;
  if (puVar4 == (uint8_t *)0x0) {
    __assert_fail("*len != 0",
                  "/workspace/llm4binary/github/license_c_cmakelists/h2o[P]picotls/t/../lib/picotls.c"
                  ,0x13ba,
                  "int parse_record(ptls_t *, struct st_ptls_record_t *, const uint8_t *, size_t *)"
                 );
  }
  if ((tls->recvbuf).rec.base == (uint8_t *)0x0) {
    if ((*src & 0xfc) != 0x14) {
      return 0x32;
    }
    if ((uint8_t *)0x4 < puVar4) {
      iVar3 = parse_record_header(rec,src);
      if (iVar3 != 0) {
        return iVar3;
      }
      puVar6 = (uint8_t *)(rec->length + 5);
      puVar4 = (uint8_t *)*len;
      if (puVar6 <= puVar4) {
        rec->fragment = src + 5;
        iVar3 = 0;
        goto LAB_0011b5da;
      }
    }
  }
  buf = &tls->recvbuf;
  rec->fragment = (uint8_t *)0x0;
  rec->type = '\0';
  rec->field_0x1 = 0;
  rec->version = 0;
  *(undefined4 *)&rec->field_0x4 = 0;
  rec->length = 0;
  if ((buf->rec).base == (uint8_t *)0x0) {
    (tls->recvbuf).rec.base = "";
    (tls->recvbuf).rec.capacity = 0;
    (tls->recvbuf).rec.off = 0;
    (tls->recvbuf).rec.is_allocated = '\0';
    (tls->recvbuf).rec.align_bits = '\0';
    iVar3 = ptls_buffer_reserve(&buf->rec,5);
    if (iVar3 != 0) {
      return iVar3;
    }
  }
  puVar6 = src + (long)puVar4;
  while (uVar2 = (tls->recvbuf).rec.off, uVar2 < 5) {
    if (puVar4 == (uint8_t *)0x0) {
      return 0x202;
    }
    uVar1 = *src;
    src = src + 1;
    puVar5 = (tls->recvbuf).rec.base;
    (tls->recvbuf).rec.off = uVar2 + 1;
    puVar5[uVar2] = uVar1;
    puVar4 = puVar4 + -1;
  }
  iVar3 = parse_record_header(rec,(buf->rec).base);
  if (iVar3 != 0) {
    return iVar3;
  }
  puVar5 = (uint8_t *)(rec->length + 5);
  delta = puVar5 + -(tls->recvbuf).rec.off;
  if (delta != (uint8_t *)0x0) {
    iVar3 = ptls_buffer_reserve(&buf->rec,(size_t)delta);
    if (iVar3 != 0) {
      return iVar3;
    }
    __n = puVar4;
    if (delta < puVar4) {
      __n = delta;
    }
    puVar5 = (uint8_t *)(tls->recvbuf).rec.off;
    if (__n != (uint8_t *)0x0) {
      memcpy(puVar5 + (long)(tls->recvbuf).rec.base,src,(size_t)__n);
      puVar5 = __n + (tls->recvbuf).rec.off;
      (tls->recvbuf).rec.off = (size_t)puVar5;
      if (puVar4 < delta) {
        delta = puVar4;
      }
      src = src + (long)delta;
    }
  }
  iVar3 = 0x202;
  if (puVar5 == (uint8_t *)(rec->length + 5)) {
    rec->fragment = (buf->rec).base + 5;
    iVar3 = 0;
  }
  puVar6 = src + (*len - (long)puVar6);
LAB_0011b5da:
  *len = (size_t)puVar6;
  return iVar3;
}

Assistant:

static int parse_record(ptls_t *tls, struct st_ptls_record_t *rec, const uint8_t *src, size_t *len)
{
    int ret;

    assert(*len != 0);

    /* Check if the first byte is something that we can handle, otherwise do not bother parsing / buffering the entire record as it
     * is obviously broken. SSL 2.0 handshakes fall into this path as well. */
    if (tls->recvbuf.rec.base == NULL) {
        uint8_t type = src[0];
        switch (type) {
        case PTLS_CONTENT_TYPE_CHANGE_CIPHER_SPEC:
        case PTLS_CONTENT_TYPE_ALERT:
        case PTLS_CONTENT_TYPE_HANDSHAKE:
        case PTLS_CONTENT_TYPE_APPDATA:
            break;
        default:
            return PTLS_ALERT_DECODE_ERROR;
        }
    }

    if (tls->recvbuf.rec.base == NULL && *len >= 5) {
        /* fast path */
        if ((ret = parse_record_header(rec, src)) != 0)
            return ret;
        if (5 + rec->length <= *len) {
            rec->fragment = src + 5;
            *len = rec->length + 5;
            return 0;
        }
    }

    /* slow path */
    const uint8_t *const end = src + *len;
    *rec = (struct st_ptls_record_t){0};

    if (tls->recvbuf.rec.base == NULL) {
        ptls_buffer_init(&tls->recvbuf.rec, "", 0);
        if ((ret = ptls_buffer_reserve(&tls->recvbuf.rec, 5)) != 0)
            return ret;
    }

    /* fill and parse the header */
    while (tls->recvbuf.rec.off < 5) {
        if (src == end)
            return PTLS_ERROR_IN_PROGRESS;
        tls->recvbuf.rec.base[tls->recvbuf.rec.off++] = *src++;
    }
    if ((ret = parse_record_header(rec, tls->recvbuf.rec.base)) != 0)
        return ret;

    /* fill the fragment */
    size_t addlen = rec->length + 5 - tls->recvbuf.rec.off;
    if (addlen != 0) {
        if ((ret = ptls_buffer_reserve(&tls->recvbuf.rec, addlen)) != 0)
            return ret;
        if (addlen > (size_t)(end - src))
            addlen = end - src;
        if (addlen != 0) {
            memcpy(tls->recvbuf.rec.base + tls->recvbuf.rec.off, src, addlen);
            tls->recvbuf.rec.off += addlen;
            src += addlen;
        }
    }

    /* set rec->fragment if a complete record has been parsed */
    if (tls->recvbuf.rec.off == rec->length + 5) {
        rec->fragment = tls->recvbuf.rec.base + 5;
        ret = 0;
    } else {
        ret = PTLS_ERROR_IN_PROGRESS;
    }

    *len -= end - src;
    return ret;
}